

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  string local_c8;
  string local_a8;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Value *local_18;
  Value *root_local;
  StyledStreamWriter *this_local;
  
  local_18 = root;
  root_local = (Value *)this;
  bVar2 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar2) {
    poVar1 = this->document_;
    Value::getComment_abi_cxx11_(&local_78,local_18,commentAfterOnSameLine);
    normalizeEOL(&local_58,&local_78);
    std::operator+(&local_38," ",&local_58);
    std::operator<<(poVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar2 = Value::hasComment(local_18,commentAfter);
  if (bVar2) {
    std::operator<<(this->document_,anon_var_dwarf_d0cd2 + 8);
    poVar1 = this->document_;
    Value::getComment_abi_cxx11_(&local_c8,local_18,commentAfter);
    normalizeEOL(&local_a8,&local_c8);
    std::operator<<(poVar1,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::operator<<(this->document_,anon_var_dwarf_d0cd2 + 8);
  }
  return;
}

Assistant:

void 
StyledStreamWriter::writeCommentAfterValueOnSameLine( const Value &root )
{
   if ( root.hasComment( commentAfterOnSameLine ) )
      *document_ << " " + normalizeEOL( root.getComment( commentAfterOnSameLine ) );

   if ( root.hasComment( commentAfter ) )
   {
      *document_ << "\n";
      *document_ << normalizeEOL( root.getComment( commentAfter ) );
      *document_ << "\n";
   }
}